

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pickrst.c
# Opt level: O2

void av1_calc_proj_params_c
               (uint8_t *src8,int width,int height,int src_stride,uint8_t *dat8,int dat_stride,
               int32_t *flt0,int flt0_stride,int32_t *flt1,int flt1_stride,int64_t (*H) [2],
               int64_t *C,sgr_params_type *params)

{
  byte bVar1;
  byte bVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  int64_t *piVar6;
  long *plVar7;
  int j_1;
  ulong uVar8;
  long lVar9;
  ulong uVar10;
  ulong uVar11;
  
  if (params->r[0] < 1) {
    if (params->r[1] < 1) {
      return;
    }
    piVar6 = H[1] + 1;
    plVar7 = C + 1;
    uVar11 = 0;
    uVar8 = 0;
    if (0 < width) {
      uVar8 = (ulong)(uint)width;
    }
    uVar10 = 0;
    if (0 < height) {
      uVar10 = (ulong)(uint)height;
    }
    for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
      for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
        bVar1 = dat8[uVar4];
        bVar2 = src8[uVar4];
        lVar3 = (long)flt1[uVar4] + (ulong)bVar1 * -0x10;
        *piVar6 = *piVar6 + lVar3 * lVar3;
        *plVar7 = *plVar7 + ((ulong)bVar2 - (ulong)bVar1) * lVar3 * 0x10;
      }
      flt1 = flt1 + flt1_stride;
      src8 = src8 + src_stride;
      dat8 = dat8 + dat_stride;
    }
  }
  else {
    if (0 < params->r[1]) {
      plVar7 = C + 1;
      uVar11 = 0;
      uVar8 = 0;
      if (0 < width) {
        uVar8 = (ulong)(uint)width;
      }
      uVar10 = 0;
      if (0 < height) {
        uVar10 = (ulong)(uint)height;
      }
      for (; uVar11 != uVar10; uVar11 = uVar11 + 1) {
        for (uVar4 = 0; uVar8 != uVar4; uVar4 = uVar4 + 1) {
          bVar1 = dat8[uVar4];
          bVar2 = src8[uVar4];
          lVar9 = (long)flt0[uVar4] + (ulong)bVar1 * -0x10;
          lVar3 = (long)flt1[uVar4] + (ulong)bVar1 * -0x10;
          (*H)[0] = (*H)[0] + lVar9 * lVar9;
          H[1][1] = H[1][1] + lVar3 * lVar3;
          lVar5 = ((ulong)bVar2 - (ulong)bVar1) * 0x10;
          (*H)[1] = (*H)[1] + lVar3 * lVar9;
          *C = *C + lVar9 * lVar5;
          C[1] = C[1] + lVar3 * lVar5;
        }
        flt1 = flt1 + flt1_stride;
        flt0 = flt0 + flt0_stride;
        src8 = src8 + src_stride;
        dat8 = dat8 + dat_stride;
      }
      lVar5 = (long)(height * width);
      lVar3 = (*H)[1];
      (*H)[0] = (*H)[0] / lVar5;
      lVar3 = lVar3 / lVar5;
      (*H)[1] = lVar3;
      H[1][1] = H[1][1] / lVar5;
      H[1][0] = lVar3;
      goto LAB_001dc5bb;
    }
    uVar8 = 0;
    uVar11 = 0;
    if (0 < width) {
      uVar11 = (ulong)(uint)width;
    }
    uVar10 = 0;
    if (0 < height) {
      uVar10 = (ulong)(uint)height;
    }
    for (; piVar6 = *H, plVar7 = C, uVar8 != uVar10; uVar8 = uVar8 + 1) {
      for (uVar4 = 0; uVar11 != uVar4; uVar4 = uVar4 + 1) {
        bVar1 = dat8[uVar4];
        bVar2 = src8[uVar4];
        lVar3 = (long)flt0[uVar4] + (ulong)bVar1 * -0x10;
        (*H)[0] = (*H)[0] + lVar3 * lVar3;
        *C = *C + ((ulong)bVar2 - (ulong)bVar1) * lVar3 * 0x10;
      }
      flt0 = flt0 + flt0_stride;
      src8 = src8 + src_stride;
      dat8 = dat8 + dat_stride;
    }
  }
  C = piVar6;
  lVar5 = (long)(height * width);
LAB_001dc5bb:
  *C = *C / lVar5;
  *plVar7 = *plVar7 / lVar5;
  return;
}

Assistant:

void av1_calc_proj_params_c(const uint8_t *src8, int width, int height,
                            int src_stride, const uint8_t *dat8, int dat_stride,
                            int32_t *flt0, int flt0_stride, int32_t *flt1,
                            int flt1_stride, int64_t H[2][2], int64_t C[2],
                            const sgr_params_type *params) {
  if ((params->r[0] > 0) && (params->r[1] > 0)) {
    calc_proj_params_r0_r1_c(src8, width, height, src_stride, dat8, dat_stride,
                             flt0, flt0_stride, flt1, flt1_stride, H, C);
  } else if (params->r[0] > 0) {
    calc_proj_params_r0_c(src8, width, height, src_stride, dat8, dat_stride,
                          flt0, flt0_stride, H, C);
  } else if (params->r[1] > 0) {
    calc_proj_params_r1_c(src8, width, height, src_stride, dat8, dat_stride,
                          flt1, flt1_stride, H, C);
  }
}